

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndicesRef
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  Index IVar1;
  const_reference ppJVar2;
  JointActionObservationHistory *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  ostream *poVar4;
  E *this_01;
  stringstream *arg;
  ulong in_RSI;
  long in_RDI;
  stringstream ss;
  JointActionObservationHistoryTree *jaoht;
  JointActionObservationHistoryTree *in_stack_fffffffffffffe30;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  value_type local_18;
  ulong local_10;
  
  if (in_RSI < *(ulong *)(in_RDI + 0x160)) {
    IVar1 = Globals::CastLIndexToIndex(in_RSI);
    ppJVar2 = std::
              vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
              ::operator[]((vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
                            *)(in_RDI + 0x2a0),(ulong)IVar1);
    local_18 = *ppJVar2;
    this_00 = JointActionObservationHistoryTree::GetJointActionObservationHistory
                        (in_stack_fffffffffffffe30);
    pvVar3 = JointActionObservationHistory::GetIndividualActionObservationHistoryIndices(this_00);
    return pvVar3;
  }
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar4 = std::operator<<(local_190,"PlanningUnitMADPDiscrete::JointToIndividualActionActObserva");
  poVar4 = std::operator<<(poVar4,"tionHistory Indices ERROR: index (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  this_01 = (E *)std::operator<<(poVar4,") out of bounds!");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  arg = (stringstream *)__cxa_allocate_exception(0x28);
  E::E(this_01,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

const vector<Index>&
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndicesRef(
        LIndex jaohI) const
{    
    if(jaohI < _m_nrJointActionObservationHistories)
    {
        JointActionObservationHistoryTree* jaoht = 
            _m_jointActionObservationHistoryTreeVector[CastLIndexToIndex(jaohI)];
        return(jaoht->GetJointActionObservationHistory()->
                GetIndividualActionObservationHistoryIndices());
    }
    else
    {
        stringstream ss;
        ss << "PlanningUnitMADPDiscrete::JointToIndividualActionActObserva"<<
            "tionHistory Indices ERROR: index ("<< jaohI <<
            ") out of bounds!"<<endl;
        throw E(ss); 
    }
}